

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRStereoNode::render
          (VRStereoNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VRGraphicsToolkit *pVVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  VRAnyCoreType VVar6;
  undefined4 extraout_var;
  VRError *pVVar7;
  VREyePosition eye;
  int iVar8;
  float y;
  string local_2f0;
  float local_2d0;
  int local_2cc;
  undefined8 local_2c8;
  float local_2bc;
  string local_2b8;
  string local_298;
  string local_278;
  VRRenderHandler *local_258;
  VRString local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  VRString local_150;
  VRString local_130;
  VRString local_110;
  string local_f0;
  VRRect local_d0;
  VRRect local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  VRDataIndex::pushState(renderState);
  switch(this->_format) {
  case VRSTEREOFORMAT_MONO:
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"StereoFormat","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Mono","");
    VRDataIndex::addData(&local_50,renderState,&local_2f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->_gfxToolkit + 0x18))(this->_gfxToolkit,0);
    eye = Cyclops;
    goto LAB_0014b78e;
  case VRSTEREOFORMAT_QUADBUFFERED:
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"StereoFormat","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"QuadBuffered","");
    VRDataIndex::addData(&local_70,renderState,&local_2f0,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->_gfxToolkit + 0x18))(this->_gfxToolkit,2);
    renderOneEye(this,renderState,renderHandler,Left);
    (**(code **)(*(long *)this->_gfxToolkit + 0x18))(this->_gfxToolkit,3);
    break;
  case VRSTEREOFORMAT_SIDEBYSIDE:
    paVar1 = &local_2f0.field_2;
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"StereoFormat","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"SideBySide","");
    VRDataIndex::addData(&local_90,renderState,&local_2f0,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ViewportX","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"");
    bVar3 = VRDataIndex::exists(renderState,&local_2f0,&local_170,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_258 = renderHandler;
    if (bVar3) {
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ViewportX","");
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_190,true);
      iVar4 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      local_2c8 = CONCAT44(extraout_var,iVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ViewportY","");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_1b0,true);
      iVar4 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ViewportWidth","");
      local_2d0 = (float)iVar4;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_1d0,true);
      iVar4 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ViewportHeight","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_1f0,true);
      iVar5 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      iVar8 = (int)local_2c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      y = (float)(int)local_2d0;
    }
    else {
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"WindowWidth","");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      bVar3 = VRDataIndex::exists(renderState,&local_2f0,&local_210,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        pVVar7 = (VRError *)__cxa_allocate_exception(0xa8);
        local_2f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f0,"VRStereoNode needs a window width.","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRStereoNode.cpp"
                   ,"");
        local_2cc = 0x44;
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,
                   "virtual void MinVR::VRStereoNode::render(VRDataIndex *, VRRenderHandler *)","");
        VRError::VRError(pVVar7,&local_2f0,&local_278,&local_298,&local_2cc,&local_2b8);
        __cxa_throw(pVVar7,&VRError::typeinfo,VRError::~VRError);
      }
      VVar6 = VRDataIndex::getValue(renderState);
      iVar4 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      local_2f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"WindowHeight","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
      bVar3 = VRDataIndex::exists(renderState,&local_2f0,&local_230,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        pVVar7 = (VRError *)__cxa_allocate_exception(0xa8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2f0,"VRStereoNode needs a window height.","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRStereoNode.cpp"
                   ,"");
        local_2cc = 0x4a;
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b8,
                   "virtual void MinVR::VRStereoNode::render(VRDataIndex *, VRRenderHandler *)","");
        VRError::VRError(pVVar7,&local_2f0,&local_278,&local_298,&local_2cc,&local_2b8);
        __cxa_throw(pVVar7,&VRError::typeinfo,VRError::~VRError);
      }
      VVar6 = VRDataIndex::getValue(renderState);
      iVar5 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      y = 0.0;
      iVar8 = 0;
    }
    local_2d0 = (float)(iVar4 / 2);
    pVVar2 = this->_gfxToolkit;
    local_2bc = (float)iVar5;
    local_2c8 = CONCAT44(local_2c8._4_4_,y);
    VRRect::VRRect(&local_b0,(float)iVar8,y,local_2d0,local_2bc,false);
    (**(code **)(*(long *)pVVar2 + 0x20))(pVVar2,&local_b0);
    VRRect::~VRRect(&local_b0);
    renderHandler = local_258;
    renderOneEye(this,renderState,local_258,Left);
    pVVar2 = this->_gfxToolkit;
    VRRect::VRRect(&local_d0,(float)(iVar8 + iVar4 / 2 + 1),(float)local_2c8,local_2d0,local_2bc,
                   false);
    (**(code **)(*(long *)pVVar2 + 0x20))(pVVar2,&local_d0);
    VRRect::~VRRect(&local_d0);
    break;
  case VRSTEREOFORMAT_COLUMNINTERLACED:
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"StereoFormat","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"ColumnInterlaced","");
    VRDataIndex::addData(&local_f0,renderState,&local_2f0,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->_gfxToolkit + 0x30))();
    renderOneEye(this,renderState,renderHandler,Left);
    (**(code **)(*(long *)this->_gfxToolkit + 0x28))();
    renderOneEye(this,renderState,renderHandler,Right);
    (**(code **)(*(long *)this->_gfxToolkit + 0x38))();
  default:
    goto switchD_0014aea0_default;
  }
  eye = Right;
LAB_0014b78e:
  renderOneEye(this,renderState,renderHandler,eye);
switchD_0014aea0_default:
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void VRStereoNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {
  renderState->pushState();

	if (_format == VRSTEREOFORMAT_MONO) {
		renderState->addData("StereoFormat", "Mono");

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACK);
		renderOneEye(renderState, renderHandler, Cyclops);
	}
	else if (_format == VRSTEREOFORMAT_QUADBUFFERED) {
		renderState->addData("StereoFormat", "QuadBuffered");

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACKLEFT);
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACKRIGHT);
		renderOneEye(renderState, renderHandler, Right);
	}
	else if (_format == VRSTEREOFORMAT_SIDEBYSIDE) {
		renderState->addData("StereoFormat", "SideBySide");

		int x,y,w,h;
		if (renderState->exists("ViewportX")) {
      x = renderState->getValue("ViewportX");
      y = renderState->getValue("ViewportY");
			w = renderState->getValue("ViewportWidth");
			h = renderState->getValue("ViewportHeight");
		}
		else {
      x = 0;
      y = 0;
      if (renderState->exists("WindowWidth")) {
        w = renderState->getValue();
      } else {
        VRERRORNOADV("VRStereoNode needs a window width.");
      }

      if (renderState->exists("WindowHeight")) {
        h = renderState->getValue();
      } else {
        VRERRORNOADV("VRStereoNode needs a window height.");
      }
		}

		_gfxToolkit->setSubWindow(VRRect((float)x, (float)y, (float)(w/2), (float)h));
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->setSubWindow(VRRect((float)(x + w / 2 + 1), (float)y, (float)(w / 2), (float)h));
		renderOneEye(renderState, renderHandler, Right);
	}
	else if (_format == VRSTEREOFORMAT_COLUMNINTERLACED) {
		renderState->addData("StereoFormat", "ColumnInterlaced");

		_gfxToolkit->disableDrawingOnEvenColumns();
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->disableDrawingOnOddColumns();
		renderOneEye(renderState, renderHandler, Right);

		_gfxToolkit->enableDrawingOnAllColumns();
	}

	renderState->popState();
}